

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplayTree.h
# Opt level: O1

void __thiscall SplayTree<unsigned_long>::rotate(SplayTree<unsigned_long> *this,Node *A,Node *B)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar2 = A->parent;
  if (A->left == B) {
    pNVar1 = B->right;
    A->left = pNVar1;
    if (pNVar1 != (Node *)0x0) {
      pNVar1->parent = A;
    }
    B->right = A;
  }
  else {
    pNVar1 = B->left;
    A->right = pNVar1;
    if (pNVar1 != (Node *)0x0) {
      pNVar1->parent = A;
    }
    B->left = A;
  }
  if (A != (Node *)0x0) {
    A->parent = B;
  }
  if (pNVar2 == (Node *)0x0) {
    this->root = B;
    pNVar2 = (Node *)0x0;
  }
  else {
    if (pNVar2->left == A) {
      pNVar2->left = B;
    }
    else {
      pNVar2->right = B;
    }
    if (B == (Node *)0x0) {
      return;
    }
  }
  B->parent = pNVar2;
  return;
}

Assistant:

void rotate(Node *A, Node *B) {
    Node *parent = A->parent;

    if (A->left == B) {
      A->setL(B->right);
      B->setR(A);
    } else {
      A->setR(B->left);
      B->setL(A);
    }

    if (!parent)
      root = B, B->parent = nullptr;
    else if (parent->left == A)
      parent->setL(B);
    else
      parent->setR(B);
  }